

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O3

void __thiscall ktx::CommandCreate::selectASTCMode(CommandCreate *this,uint32_t bitLength)

{
  ktx_uint32_t kVar1;
  bool bVar2;
  VkFormat VVar3;
  
  kVar1 = (this->options).super_OptionsEncodeASTC.super_ktxAstcParams.mode;
  if (kVar1 == 0) {
    (this->options).super_OptionsEncodeASTC.super_ktxAstcParams.mode = 2 - (bitLength < 9);
  }
  else if (kVar1 == 1 && 8 < bitLength) {
    Reporter::warning<char_const(&)[90]>
              (&(this->super_Command).super_Reporter,
               (char (*) [90])
               "Input file is 16-bit but ASTC LDR option is specified. Expect quality loss in the output."
              );
  }
  else if (kVar1 == 2 && bitLength < 0x10) {
    Reporter::warning<char_const(&)[54]>
              (&(this->super_Command).super_Reporter,
               (char (*) [54])"Input file is not 16-bit but HDR option is specified.");
  }
  bVar2 = isFormatSRGB((this->options).super_OptionsCreate.vkFormat);
  VVar3 = VK_FORMAT_R8G8B8A8_UNORM;
  if (bVar2) {
    VVar3 = VK_FORMAT_R8G8B8A8_SRGB;
  }
  (this->options).super_OptionsCreate.vkFormat = VVar3;
  return;
}

Assistant:

void CommandCreate::selectASTCMode(uint32_t bitLength) {
    if (options.mode == KTX_PACK_ASTC_ENCODER_MODE_DEFAULT) {
        // If no astc mode option is specified and if input is <= 8bit
        // default to LDR otherwise default to HDR
        options.mode = bitLength <= 8 ? KTX_PACK_ASTC_ENCODER_MODE_LDR : KTX_PACK_ASTC_ENCODER_MODE_HDR;
    } else {
        if (bitLength > 8 && options.mode == KTX_PACK_ASTC_ENCODER_MODE_LDR)
            // Input is > 8-bit and user wants LDR, issue quality loss warning.
            warning("Input file is 16-bit but ASTC LDR option is specified. Expect quality loss in the output.");
        else if (bitLength < 16 && options.mode == KTX_PACK_ASTC_ENCODER_MODE_HDR)
            // Input is < 16-bit and user wants HDR, issue warning.
            warning("Input file is not 16-bit but HDR option is specified.");
    }

    // ASTC Encoding is performed by first creating a RGBA8 texture then encode it afterward

    // Encode based on non-8-bit input (aka true HDR) is currently not supported by
    // ktxTexture2_CompressAstcEx. Once supported suitable formats can be chosen here
    if (isFormatSRGB(options.vkFormat))
        options.vkFormat = VK_FORMAT_R8G8B8A8_SRGB;
    else
        options.vkFormat = VK_FORMAT_R8G8B8A8_UNORM;
}